

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UnicodeString *
icu_63::DateFormat::getBestPattern
          (UnicodeString *__return_storage_ptr__,Locale *locale,UnicodeString *skeleton,
          UErrorCode *status)

{
  UBool UVar1;
  DateFmtBestPattern *local_168;
  DateFmtBestPattern *patternPtr;
  DateFmtBestPatternKey key;
  UnifiedCache *cache;
  UErrorCode *status_local;
  UnicodeString *skeleton_local;
  Locale *locale_local;
  UnicodeString *result;
  
  key.fSkeleton.fUnion._48_8_ = UnifiedCache::getInstance(status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    DateFmtBestPatternKey::DateFmtBestPatternKey
              ((DateFmtBestPatternKey *)&patternPtr,locale,skeleton,status);
    local_168 = (DateFmtBestPattern *)0x0;
    UnifiedCache::get<icu_63::DateFmtBestPattern>
              ((UnifiedCache *)key.fSkeleton.fUnion._48_8_,
               (CacheKey<icu_63::DateFmtBestPattern> *)&patternPtr,&local_168,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_168->fPattern);
      SharedObject::removeRef(&local_168->super_SharedObject);
    }
    else {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    }
    DateFmtBestPatternKey::~DateFmtBestPatternKey((DateFmtBestPatternKey *)&patternPtr);
  }
  else {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString U_EXPORT2
DateFormat::getBestPattern(
        const Locale &locale,
        const UnicodeString &skeleton,
        UErrorCode &status) {
    UnifiedCache *cache = UnifiedCache::getInstance(status);
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    DateFmtBestPatternKey key(locale, skeleton, status);
    const DateFmtBestPattern *patternPtr = NULL;
    cache->get(key, patternPtr, status);
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString result(patternPtr->fPattern);
    patternPtr->removeRef();
    return result;
}